

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglImageTests.cpp
# Opt level: O1

void deqp::egl::Image::checkCallReturn<void*>
               (EglTestContext *eglTestCtx,char *call,void *returnValue,void *expectReturnValue,
               EGLint expectError)

{
  ostringstream *poVar1;
  TestContext *this;
  TestLog *pTVar2;
  int iVar3;
  size_t sVar4;
  Library *pLVar5;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [384];
  
  this = eglTestCtx->m_testCtx;
  pTVar2 = this->m_log;
  poVar1 = (ostringstream *)(local_1b0 + 8);
  local_1b0._0_8_ = pTVar2;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  if (call == (char *)0x0) {
    std::ios::clear((int)*(undefined8 *)(local_1b0._8_8_ + -0x18) + (int)poVar1);
  }
  else {
    sVar4 = strlen(call);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,call,sVar4);
  }
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(poVar1);
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
  pLVar5 = EglTestContext::getLibrary(eglTestCtx);
  iVar3 = (*pLVar5->_vptr_Library[0x1f])(pLVar5);
  if (returnValue != expectReturnValue) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"  Fail: Return value mismatch! Expected ",0x28);
    std::ostream::_M_insert<void_const*>(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
    std::ostream::_M_insert<void_const*>(poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if (this->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this,QP_TEST_RESULT_FAIL,"Invalid return value");
    }
  }
  if (iVar3 != expectError) {
    poVar1 = (ostringstream *)(local_1b0 + 8);
    local_1b0._0_8_ = pTVar2;
    std::__cxx11::ostringstream::ostringstream(poVar1);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)poVar1,"  Fail: Error code mismatch! Expected ",0x26);
    local_1c0.m_getName = eglu::getErrorName;
    local_1c0.m_value = expectError;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)poVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,", got ",6);
    local_1d0.m_getName = eglu::getErrorName;
    local_1d0.m_value = iVar3;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)poVar1);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(poVar1);
    std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x78));
    if (this->m_testResult == QP_TEST_RESULT_PASS) {
      tcu::TestContext::setTestResult(this,QP_TEST_RESULT_FAIL,"Invalid error code");
    }
  }
  return;
}

Assistant:

void checkCallReturn (EglTestContext& eglTestCtx, const char* call, RetVal returnValue, RetVal expectReturnValue, EGLint expectError)
{
	tcu::TestContext&	testCtx		= eglTestCtx.getTestContext();
	TestLog&			log			= testCtx.getLog();
	EGLint				error;

	log << TestLog::Message << call << TestLog::EndMessage;

	error = eglTestCtx.getLibrary().getError();

	if (returnValue != expectReturnValue)
	{
		log << TestLog::Message << "  Fail: Return value mismatch! Expected " << expectReturnValue << ", got " << returnValue << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid return value");
	}

	if (error != expectError)
	{
		log << TestLog::Message << "  Fail: Error code mismatch! Expected " << eglu::getErrorStr(expectError) << ", got " << eglu::getErrorStr(error) << TestLog::EndMessage;

		if (testCtx.getTestResult() == QP_TEST_RESULT_PASS)
			testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Invalid error code");
	}
}